

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void remove_subquery(ecs_query_t *parent,ecs_query_t *sub)

{
  int32_t iVar1;
  void *pvVar2;
  ecs_query_t **sq;
  int32_t count;
  int32_t i;
  ecs_query_t *sub_local;
  ecs_query_t *parent_local;
  
  _ecs_assert(parent != (ecs_query_t *)0x0,0xc,(char *)0x0,"parent != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x837);
  if (parent == (ecs_query_t *)0x0) {
    __assert_fail("parent != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x837,"void remove_subquery(ecs_query_t *, ecs_query_t *)");
  }
  _ecs_assert(sub != (ecs_query_t *)0x0,0xc,(char *)0x0,"sub != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x838);
  if (sub != (ecs_query_t *)0x0) {
    _ecs_assert(parent->subqueries != (ecs_vector_t *)0x0,0xc,(char *)0x0,
                "parent->subqueries != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x839);
    if (parent->subqueries != (ecs_vector_t *)0x0) {
      iVar1 = ecs_vector_count(parent->subqueries);
      pvVar2 = _ecs_vector_first(parent->subqueries,8,0x10);
      sq._4_4_ = 0;
      while ((sq._4_4_ < iVar1 && (*(ecs_query_t **)((long)pvVar2 + (long)sq._4_4_ * 8) != sub))) {
        sq._4_4_ = sq._4_4_ + 1;
      }
      _ecs_vector_remove_index(parent->subqueries,8,0x10,sq._4_4_);
      return;
    }
    __assert_fail("parent->subqueries != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x839,"void remove_subquery(ecs_query_t *, ecs_query_t *)");
  }
  __assert_fail("sub != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x838,"void remove_subquery(ecs_query_t *, ecs_query_t *)");
}

Assistant:

static
void remove_subquery(
    ecs_query_t *parent, 
    ecs_query_t *sub)
{
    ecs_assert(parent != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(sub != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(parent->subqueries != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t i, count = ecs_vector_count(parent->subqueries);
    ecs_query_t **sq = ecs_vector_first(parent->subqueries, ecs_query_t*);

    for (i = 0; i < count; i ++) {
        if (sq[i] == sub) {
            break;
        }
    }

    ecs_vector_remove_index(parent->subqueries, ecs_query_t*, i);
}